

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

void freedirs(ftp_conn *ftpc)

{
  int iVar1;
  char **ppcVar2;
  long lVar3;
  
  ppcVar2 = ftpc->dirs;
  if (ppcVar2 != (char **)0x0) {
    iVar1 = ftpc->dirdepth;
    if (0 < iVar1) {
      lVar3 = 0;
      do {
        if (ftpc->dirs[lVar3] != (char *)0x0) {
          (*Curl_cfree)(ftpc->dirs[lVar3]);
          ftpc->dirs[lVar3] = (char *)0x0;
          iVar1 = ftpc->dirdepth;
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < iVar1);
      ppcVar2 = ftpc->dirs;
    }
    (*Curl_cfree)(ppcVar2);
    ftpc->dirs = (char **)0x0;
    ftpc->dirdepth = 0;
  }
  if (ftpc->file != (char *)0x0) {
    (*Curl_cfree)(ftpc->file);
    ftpc->file = (char *)0x0;
  }
  return;
}

Assistant:

static void freedirs(struct ftp_conn *ftpc)
{
  int i;
  if(ftpc->dirs) {
    for(i=0; i < ftpc->dirdepth; i++) {
      if(ftpc->dirs[i]) {
        free(ftpc->dirs[i]);
        ftpc->dirs[i]=NULL;
      }
    }
    free(ftpc->dirs);
    ftpc->dirs = NULL;
    ftpc->dirdepth = 0;
  }
  if(ftpc->file) {
    free(ftpc->file);
    ftpc->file = NULL;
  }
}